

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_8,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  bool bVar5;
  float scalar;
  undefined4 uVar6;
  Type in0;
  undefined8 uStack_70;
  float local_64 [3];
  Matrix<float,_2,_3> local_58;
  int local_40 [6];
  Matrix<float,_2,_3> local_28;
  
  pfVar1 = (float *)&local_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar6 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pfVar1 = pfVar1 + 1;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    local_58.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_58.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_58.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    local_58.m_data.m_data[2].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[1] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat3x2;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
      bVar5 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    scalar = (evalCtx->coords).m_data[0];
  }
  else {
    scalar = -0.2;
  }
  uStack_70 = 0x59ddf8;
  tcu::operator/(&local_28,&local_58,scalar);
  local_64[0] = local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1];
  local_64[1] = local_28.m_data.m_data[1].m_data[0] + local_28.m_data.m_data[1].m_data[1];
  local_64[2] = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar2]] = *(float *)((long)&uStack_70 + lVar2 * 4 + 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}